

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_BlockSizeSmallerThanAllocation_Test::
~ArenaTest_BlockSizeSmallerThanAllocation_Test(ArenaTest_BlockSizeSmallerThanAllocation_Test *this)

{
  ArenaTest_BlockSizeSmallerThanAllocation_Test *this_local;
  
  ~ArenaTest_BlockSizeSmallerThanAllocation_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, BlockSizeSmallerThanAllocation) {
  for (size_t i = 0; i <= 8; ++i) {
    ArenaOptions opt;
    opt.start_block_size = opt.max_block_size = i;
    Arena arena(opt);

    *Arena::Create<int64_t>(&arena) = 42;
    EXPECT_GE(arena.SpaceAllocated(), 8);
    EXPECT_EQ(8, arena.SpaceUsed());

    *Arena::Create<int64_t>(&arena) = 42;
    EXPECT_GE(arena.SpaceAllocated(), 16);
    EXPECT_EQ(16, arena.SpaceUsed());
  }
}